

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

cmStateSnapshot * __thiscall
cmListFileBacktrace::GetBottom(cmStateSnapshot *__return_storage_ptr__,cmListFileBacktrace *this)

{
  element_type *peVar1;
  Entry *parent;
  Entry *cur;
  cmListFileBacktrace *this_local;
  
  cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,(cmState *)0x0);
  peVar1 = std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
                      this);
  if (peVar1 != (element_type *)0x0) {
    do {
      parent = peVar1;
      peVar1 = std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(parent->Parent).
                           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                         );
    } while (peVar1 != (element_type *)0x0);
    __return_storage_ptr__->State = (parent->field_0).Bottom.State;
    (__return_storage_ptr__->Position).Tree = (parent->field_0).Bottom.Position.Tree;
    (__return_storage_ptr__->Position).Position = (parent->field_0).Bottom.Position.Position;
  }
  return __return_storage_ptr__;
}

Assistant:

cmStateSnapshot cmListFileBacktrace::GetBottom() const
{
  cmStateSnapshot bottom;
  if (Entry const* cur = this->TopEntry.get()) {
    while (Entry const* parent = cur->Parent.get()) {
      cur = parent;
    }
    bottom = cur->Bottom;
  }
  return bottom;
}